

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O2

int cgltf_parse_json_unprocessed_extensions
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_size *out_extensions_count,cgltf_extension **out_extensions)

{
  int iVar1;
  cgltf_size cVar2;
  cgltf_extension *pcVar3;
  int i_00;
  int iVar4;
  
  if ((tokens[(long)i + 1].type == JSMN_OBJECT) && (*out_extensions == (cgltf_extension *)0x0)) {
    iVar1 = tokens[(long)i + 1].size;
    *out_extensions_count = 0;
    pcVar3 = (cgltf_extension *)cgltf_calloc(options,0x10,(long)iVar1);
    *out_extensions = pcVar3;
    if (pcVar3 == (cgltf_extension *)0x0) {
      i_00 = -2;
    }
    else {
      i_00 = i + 2;
      iVar4 = 0;
      if (0 < iVar1) {
        iVar4 = iVar1;
      }
      iVar4 = iVar4 + 1;
      do {
        iVar4 = iVar4 + -1;
        if (iVar4 == 0) {
          return i_00;
        }
        if ((tokens[i_00].type != JSMN_STRING) || (tokens[i_00].size == 0)) {
          return -1;
        }
        cVar2 = *out_extensions_count;
        *out_extensions_count = cVar2 + 1;
        i_00 = cgltf_parse_json_unprocessed_extension
                         (options,tokens,i_00,json_chunk,*out_extensions + cVar2);
      } while (-1 < i_00);
    }
  }
  else {
    i_00 = -1;
  }
  return i_00;
}

Assistant:

static int cgltf_parse_json_unprocessed_extensions(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_size* out_extensions_count, cgltf_extension** out_extensions)
{
	++i;

	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);
	if(*out_extensions)
	{
		return CGLTF_ERROR_JSON;
	}

	int extensions_size = tokens[i].size;
	*out_extensions_count = 0;
	*out_extensions = (cgltf_extension*)cgltf_calloc(options, sizeof(cgltf_extension), extensions_size);

	if (!*out_extensions)
	{
		return CGLTF_ERROR_NOMEM;
	}

	++i;

	for (int j = 0; j < extensions_size; ++j)
	{
		CGLTF_CHECK_KEY(tokens[i]);

		cgltf_size extension_index = (*out_extensions_count)++;
		cgltf_extension* extension = &((*out_extensions)[extension_index]);
		i = cgltf_parse_json_unprocessed_extension(options, tokens, i, json_chunk, extension);

		if (i < 0)
		{
			return i;
		}
	}
	return i;
}